

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::toApp(Application *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  DoNotSend *this_01;
  ostream *poVar2;
  FieldNotFound *anon_var_0;
  string local_a8;
  undefined1 local_78 [8];
  PossDupFlag possDupFlag;
  SessionID *sessionID_local;
  Message *message_local;
  Application *this_local;
  
  possDupFlag.super_BoolField.super_FieldBase.m_metrics = (field_metrics)sessionID;
  FIX::PossDupFlag::PossDupFlag((PossDupFlag *)local_78);
  this_00 = FIX::Message::getHeader(message);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_78);
  bVar1 = FIX::BoolField::operator_cast_to_bool((BoolField *)local_78);
  if (!bVar1) {
    FIX::PossDupFlag::~PossDupFlag((PossDupFlag *)local_78);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"OUT: ");
    poVar2 = FIX::operator<<(poVar2,message);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return;
  }
  anon_var_0._6_1_ = 1;
  this_01 = (DoNotSend *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"",(allocator<char> *)((long)&anon_var_0 + 7));
  FIX::DoNotSend::DoNotSend(this_01,&local_a8);
  anon_var_0._6_1_ = 0;
  __cxa_throw(this_01,&FIX::DoNotSend::typeinfo,FIX::DoNotSend::~DoNotSend);
}

Assistant:

EXCEPT(FIX::DoNotSend) {
  try {
    FIX::PossDupFlag possDupFlag;
    message.getHeader().getField(possDupFlag);
    if (possDupFlag) {
      throw FIX::DoNotSend();
    }
  } catch (FIX::FieldNotFound &) {}

  std::cout << std::endl << "OUT: " << message << std::endl;
}